

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

bool __thiscall
tf::BoundedTaskQueue<tf::Node_*,_8UL>::empty(BoundedTaskQueue<tf::Node_*,_8UL> *this)

{
  long lVar1;
  long *in_RDI;
  int64_t b;
  int64_t t;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  lVar1 = *in_RDI;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return in_RDI[0x10] <= lVar1;
}

Assistant:

bool BoundedTaskQueue<T, LogSize>::empty() const noexcept {
  int64_t t = _top.load(std::memory_order_relaxed);
  int64_t b = _bottom.load(std::memory_order_relaxed);
  return b <= t;
}